

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O3

vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *
CRange::init_target(vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *__return_storage_ptr__,
                   string *targetfile)

{
  int iVar1;
  ostream *poVar2;
  dictionary *d;
  char *n;
  int n_00;
  undefined1 local_b8 [8];
  Tdata t;
  
  (__return_storage_ptr__->super__Vector_base<CRange::Tdata,_std::allocator<CRange::Tdata>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CRange::Tdata,_std::allocator<CRange::Tdata>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CRange::Tdata,_std::allocator<CRange::Tdata>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (targetfile->_M_string_length != 0) {
    iVar1 = access((targetfile->_M_dataplus)._M_p,4);
    if (iVar1 == 0) {
      d = iniparser_load((targetfile->_M_dataplus)._M_p);
      iVar1 = iniparser_getnsec(d);
      if (0 < iVar1) {
        n_00 = 0;
        do {
          n = iniparser_getsecname(d,n_00);
          Tdata::Tdata((Tdata *)local_b8,n,d);
          std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::push_back
                    (__return_storage_ptr__,(Tdata *)local_b8);
          if (local_b8 != (undefined1  [8])&t._name._M_string_length) {
            operator_delete((void *)local_b8);
          }
          n_00 = n_00 + 1;
        } while (iVar1 != n_00);
      }
      iniparser_freedict(d);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not read target file: ",0x1c);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(targetfile->_M_dataplus)._M_p,
                          targetfile->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,". Using default target data.",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  default_target(__return_storage_ptr__);
  std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::operator=
            (__return_storage_ptr__,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CRange::Tdata> CRange::init_target( const std::string &targetfile )
{
    std::vector<CRange::Tdata> target_list;
    if (targetfile.length() > 0) {
        if (access(targetfile.c_str(), R_OK) == 0) {
            dictionary *d = iniparser_load(targetfile.c_str());
            int nsec = iniparser_getnsec(d);
            for (int i = 0; i < nsec; i++) {
                const char *sec = iniparser_getsecname(d, i);
                CRange::Tdata t(sec, d);
                target_list.push_back(t);
            }
            iniparser_freedict(d);
        } else {
            std::cerr << "Could not read target file: " << targetfile
                      << ". Using default target data." << std::endl;
        }
    }
    target_list = CRange::default_target(target_list);
    return target_list;
}